

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

double calc_output_single(SINC_FILTER *filter,increment_t increment,increment_t start_filter_index)

{
  increment_t iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int indx;
  int coeff_count;
  int data_index;
  increment_t max_filter_index;
  increment_t filter_index;
  double icoeff;
  double right;
  double left;
  double fraction;
  undefined4 local_3c;
  undefined4 local_34;
  undefined8 local_28;
  undefined8 local_20;
  
  iVar1 = int_to_fp(*(int *)(in_RDI + 0x28));
  local_3c = (iVar1 - in_EDX) / in_ESI;
  local_34 = in_EDX + local_3c * in_ESI;
  local_3c = *(int *)(in_RDI + 0x48) - local_3c;
  local_20 = 0.0;
  do {
    dVar3 = fp_to_double(0);
    iVar2 = fp_to_int(local_34);
    local_20 = (dVar3 * (double)(*(float *)(*(long *)(in_RDI + 0x40) + (long)(iVar2 + 1) * 4) -
                                *(float *)(*(long *)(in_RDI + 0x40) + (long)iVar2 * 4)) +
               (double)*(float *)(*(long *)(in_RDI + 0x40) + (long)iVar2 * 4)) *
               (double)*(float *)(in_RDI + 0x858 + (long)local_3c * 4) + local_20;
    local_34 = local_34 - in_ESI;
    local_3c = local_3c + 1;
  } while (-1 < local_34);
  local_3c = (iVar1 - (in_ESI - in_EDX)) / in_ESI;
  local_34 = (in_ESI - in_EDX) + local_3c * in_ESI;
  local_3c = *(int *)(in_RDI + 0x48) + 1 + local_3c;
  local_28 = 0.0;
  do {
    dVar3 = fp_to_double(0);
    iVar2 = fp_to_int(local_34);
    local_28 = (dVar3 * (double)(*(float *)(*(long *)(in_RDI + 0x40) + (long)(iVar2 + 1) * 4) -
                                *(float *)(*(long *)(in_RDI + 0x40) + (long)iVar2 * 4)) +
               (double)*(float *)(*(long *)(in_RDI + 0x40) + (long)iVar2 * 4)) *
               (double)*(float *)(in_RDI + 0x858 + (long)local_3c * 4) + local_28;
    local_34 = local_34 - in_ESI;
    local_3c = local_3c + -1;
  } while (0 < local_34);
  return local_20 + local_28;
}

Assistant:

static inline double
calc_output_single (SINC_FILTER *filter, increment_t increment, increment_t start_filter_index)
{	double		fraction, left, right, icoeff ;
	increment_t	filter_index, max_filter_index ;
	int			data_index, coeff_count, indx ;

	/* Convert input parameters into fixed point. */
	max_filter_index = int_to_fp (filter->coeff_half_len) ;

	/* First apply the left half of the filter. */
	filter_index = start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current - coeff_count ;

	left = 0.0 ;
	do
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;

		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;

		left += icoeff * filter->buffer [data_index] ;

		filter_index -= increment ;
		data_index = data_index + 1 ;
		}
	while (filter_index >= MAKE_INCREMENT_T (0)) ;

	/* Now apply the right half of the filter. */
	filter_index = increment - start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current + 1 + coeff_count ;

	right = 0.0 ;
	do
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;

		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;

		right += icoeff * filter->buffer [data_index] ;

		filter_index -= increment ;
		data_index = data_index - 1 ;
		}
	while (filter_index > MAKE_INCREMENT_T (0)) ;

	return (left + right) ;
}